

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O0

bool __thiscall TestRunner::runTests(TestRunner *this,path *dir,string *executableName)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view text;
  undefined1 auVar6 [16];
  size_type local_128;
  undefined1 local_120 [16];
  path local_110;
  undefined1 local_f0 [8];
  string testName;
  string errors;
  size_type local_90;
  long local_88;
  undefined1 local_80 [8];
  string line;
  size_t i;
  undefined4 local_50;
  uint successCount;
  undefined1 local_40 [8];
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> tests;
  string *executableName_local;
  path *dir_local;
  TestRunner *this_local;
  
  tests.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)executableName;
  std::__cxx11::string::operator=((string *)this,(string *)executableName);
  getTestsList((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)local_40,
               this,dir);
  bVar2 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::empty
                    ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                     local_40);
  if (bVar2) {
    Logger::printLine<>("No tests to run");
    this_local._7_1_ = true;
  }
  else {
    i._4_4_ = 0;
    line.field_2._8_8_ = 0;
    while( true ) {
      uVar1 = line.field_2._8_8_;
      sVar3 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::size
                        ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                         local_40);
      if (sVar3 <= (ulong)uVar1) break;
      changeConsoleColor(this,White);
      local_88 = line.field_2._8_8_ + 1;
      local_90 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::size
                           ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *
                            )local_40);
      pvVar4 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
               operator[]((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                          local_40,line.field_2._8_8_);
      ghc::filesystem::path::u8string_abi_cxx11_((string *)((long)&errors.field_2 + 8),pvVar4);
      tinyformat::format<unsigned_long,unsigned_long,std::__cxx11::string>
                ((string *)local_80,(tinyformat *)"Test %d of %d, %s:",(char *)&local_88,&local_90,
                 (unsigned_long *)(errors.field_2._M_local_buf + 8),in_R9);
      std::__cxx11::string::~string((string *)(errors.field_2._M_local_buf + 8));
      Logger::print<std::__cxx11::string>
                ("%-60s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
      std::__cxx11::string::string((string *)(testName.field_2._M_local_buf + 8));
      pvVar4 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
               operator[]((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                          local_40,line.field_2._8_8_);
      ghc::filesystem::path::filename(&local_110,pvVar4);
      ghc::filesystem::path::u8string_abi_cxx11_((string *)local_f0,&local_110);
      ghc::filesystem::path::~path(&local_110);
      pvVar4 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
               operator[]((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                          local_40,line.field_2._8_8_);
      bVar2 = executeTest(this,pvVar4,(string *)local_f0,(string *)((long)&testName.field_2 + 8));
      if (bVar2) {
        changeConsoleColor(this,Green);
        Logger::printLine<>("PASSED");
        i._4_4_ = i._4_4_ + 1;
      }
      else {
        changeConsoleColor(this,Red);
        Logger::printLine<>("FAILED");
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)(testName.field_2._M_local_buf + 8));
        text._M_str = auVar6._8_8_;
        text._M_len = (size_t)text._M_str;
        local_120 = auVar6;
        Logger::printLine(auVar6._0_8_,text);
      }
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_80);
      line.field_2._8_8_ = line.field_2._8_8_ + 1;
    }
    changeConsoleColor(this,White);
    local_128 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::size
                          ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                           local_40);
    Logger::printLine<unsigned_int,unsigned_long>
              ("\n%d out of %d tests passed.",(uint *)((long)&i + 4),&local_128);
    uVar5 = (ulong)i._4_4_;
    sVar3 = std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::size
                      ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                       local_40);
    this_local._7_1_ = uVar5 == sVar3;
  }
  local_50 = 1;
  std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector
            ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool TestRunner::runTests(const fs::path& dir, const std::string& executableName)
{
	this->executableName = executableName;

	std::vector<fs::path> tests = getTestsList(dir);
	if (tests.empty())
	{
		Logger::printLine("No tests to run");
		return true;
	}

	unsigned int successCount = 0;
	for (size_t i = 0; i < tests.size(); i++)
	{
		changeConsoleColor(ConsoleColors::White);

		std::string line = tfm::format("Test %d of %d, %s:",i+1,tests.size(),tests[i].u8string());
		Logger::print("%-60s",line);

		std::string errors;

		std::string testName = tests[i].filename().u8string();
		if (!executeTest(tests[i],testName,errors))
		{
			changeConsoleColor(ConsoleColors::Red);
			Logger::printLine("FAILED");
			Logger::printLine(errors);
		} else {
			changeConsoleColor(ConsoleColors::Green);
			Logger::printLine("PASSED");
			successCount++;
		}
	}
	
	changeConsoleColor(ConsoleColors::White);
	Logger::printLine("\n%d out of %d tests passed.",successCount,tests.size());

	return successCount == tests.size();
}